

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O1

void nn_req_action_send(nn_req *self,int allow_delay)

{
  int iVar1;
  nn_pipe *to;
  nn_msg msg;
  nn_pipe *local_80;
  nn_msg local_78;
  
  nn_msg_cp(&local_78,&(self->task).request);
  iVar1 = nn_xreq_send_to((nn_sockbase *)self,&local_78,&local_80);
  if (iVar1 == 0) {
    nn_timer_start(&(self->task).timer,self->resend_ivl);
    if (local_80 != (nn_pipe *)0x0) {
      (self->task).sent_to = local_80;
      iVar1 = 4;
LAB_00130c79:
      self->state = iVar1;
      return;
    }
  }
  else {
    if (iVar1 == -0xb) {
      if (allow_delay == 1) {
        nn_msg_term(&local_78);
        iVar1 = 3;
        goto LAB_00130c79;
      }
      goto LAB_00130caf;
    }
    nn_req_action_send_cold_3();
  }
  nn_req_action_send_cold_1();
LAB_00130caf:
  nn_req_action_send_cold_2();
}

Assistant:

void nn_req_action_send (struct nn_req *self, int allow_delay)
{
    int rc;
    struct nn_msg msg;
    struct nn_pipe *to;

    /*  Send the request. */
    nn_msg_cp (&msg, &self->task.request);
    rc = nn_xreq_send_to (&self->xreq.sockbase, &msg, &to);

    /*  If the request cannot be sent at the moment wait till
        new outbound pipe arrives. */
    if (nn_slow (rc == -EAGAIN)) {
        nn_assert (allow_delay == 1);
        nn_msg_term (&msg);
        self->state = NN_REQ_STATE_DELAYED;
        return;
    }

    /*  Request was successfully sent. Set up the re-send timer
        in case the request gets lost somewhere further out
        in the topology. */
    if (nn_fast (rc == 0)) {
        nn_timer_start (&self->task.timer, self->resend_ivl);
        nn_assert (to);
        self->task.sent_to = to;
        self->state = NN_REQ_STATE_ACTIVE;
        return;
    }

    /*  Unexpected error. */
    errnum_assert (0, -rc);
}